

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O1

ON_wString ON_wString::FormatToString(wchar_t *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  wchar_t *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ON_wStringBuffer buffer;
  va_list args;
  ON_wStringBuffer local_118;
  __va_list_tag local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  ON_wStringBuffer::ON_wStringBuffer(&local_118);
  local_f8.overflow_arg_area = &buffer.m_buffer_capacity;
  local_f8.gp_offset = 0x10;
  local_f8.fp_offset = 0x30;
  local_f8.reg_save_area = local_d8;
  FormatVargsIntoBuffer(&local_118,in_RSI,&local_f8);
  ON_wString((ON_wString *)format,local_118.m_buffer);
  ON_wStringBuffer::~ON_wStringBuffer(&local_118);
  return (ON_wString)format;
}

Assistant:

const ON_wString ON_VARGS_FUNC_CDECL ON_wString::FormatToString(
  const wchar_t* format,
  ...
  )
{
  ON_wStringBuffer buffer;
  va_list args;
  va_start(args, format);
  ON_wString::FormatVargsIntoBuffer(buffer, format, args);
  va_end(args);
  return ON_wString(buffer.m_buffer);
}